

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

uint8_t __thiscall m6502::LSR(m6502 *this)

{
  byte bVar1;
  pointer __n;
  
  fetch(this);
  bVar1 = this->fetched;
  this->status = (bVar1 < 2) * '\x02' | this->status & 0x7c | bVar1 & 1;
  __n = (this->lookup).super__Vector_base<m6502::INSTRUCTION,_std::allocator<m6502::INSTRUCTION>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (((code *)__n[this->opcode].addrmode == IMP) && (*(long *)&__n[this->opcode].field_0x38 == 0))
  {
    this->a = bVar1 >> 1;
  }
  else {
    write(this,(uint)this->addrAbs,(void *)(ulong)(bVar1 >> 1),(size_t)__n);
  }
  return '\0';
}

Assistant:

uint8_t LSR()
  {
    fetch();
    SetFlag(C, fetched & 0x0001u);
    uint16_t tmp = fetched >> 1;
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    if (lookup[opcode].addrmode == &m6502::IMP)
    {
      a = tmp & 0x00FFu;
    }
    else
    {
      write(addrAbs, tmp & 0x00FFu);
    }
    return 0;
  }